

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_err_conv(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  GCstr *pGVar1;
  uint in_ECX;
  uint *in_RDX;
  long in_RDI;
  char *src;
  char *dst;
  GCstr *in_stack_000001f8;
  CTypeID in_stack_00000204;
  lua_State *in_stack_00000208;
  int local_34;
  GCstr *local_30;
  
  pGVar1 = lj_ctype_repr(in_stack_00000208,in_stack_00000204,in_stack_000001f8);
  if ((in_ECX & 2) == 0) {
    local_30 = lj_ctype_repr(in_stack_00000208,in_stack_00000204,in_stack_000001f8);
    local_30 = local_30 + 1;
  }
  else {
    if (*in_RDX >> 0x1c == 0) {
      local_34 = 3;
    }
    else {
      local_34 = 0;
      if (*in_RDX >> 0x1c == 3) {
        local_34 = 4;
      }
    }
    local_30 = (GCstr *)lj_obj_typename[local_34 + 1];
  }
  if (in_ECX >> 8 == 0) {
    lj_err_callerv(*(lua_State **)(in_RDI + 0x10),LJ_ERR_FFI_BADCONV,local_30,pGVar1 + 1);
  }
  lj_err_argv(*(lua_State **)(in_RDI + 0x10),(int)(ulong)(in_ECX >> 8),LJ_ERR_FFI_BADCONV,local_30,
              pGVar1 + 1);
}

Assistant:

LJ_NORET static void cconv_err_conv(CTState *cts, CType *d, CType *s,
				    CTInfo flags)
{
  const char *dst = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, d), NULL));
  const char *src;
  if ((flags & CCF_FROMTV))
    src = lj_obj_typename[1+(ctype_isnum(s->info) ? LUA_TNUMBER :
			     ctype_isarray(s->info) ? LUA_TSTRING : LUA_TNIL)];
  else
    src = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, s), NULL));
  if (CCF_GETARG(flags))
    lj_err_argv(cts->L, CCF_GETARG(flags), LJ_ERR_FFI_BADCONV, src, dst);
  else
    lj_err_callerv(cts->L, LJ_ERR_FFI_BADCONV, src, dst);
}